

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v10::detail::bigint::subtract_bigits(bigint *this,int index,bigit other,bigit *borrow)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  if (index < 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/core.h"
                ,0x189,"negative value");
  }
  uVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_[(uint)index];
  uVar2 = *borrow;
  if (index < 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/core.h"
                ,0x189,"negative value");
  }
  lVar3 = (ulong)uVar1 - ((ulong)other + (ulong)uVar2);
  (this->bigits_).super_buffer<unsigned_int>.ptr_[(uint)index] = (uint)lVar3;
  *borrow = (uint)((ulong)lVar3 >> 0x3f);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_bigits(int index, bigit other, bigit& borrow) {
    auto result = static_cast<double_bigit>((*this)[index]) - other - borrow;
    (*this)[index] = static_cast<bigit>(result);
    borrow = static_cast<bigit>(result >> (bigit_bits * 2 - 1));
  }